

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O3

void __thiscall sznet::MinHeap<event>::checkHeap(MinHeap<event> *this)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = this->m_size - 1;
  if (uVar5 != 0) {
    uVar6 = uVar5;
    do {
      uVar2 = (ulong)uVar5;
      uVar3 = uVar5 - 1;
      bVar7 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      uVar4 = (ulong)(uVar3 >> 1);
      if (bVar7) {
        uVar4 = 0;
      }
      iVar1 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar4],this->m_ptrArr[uVar2]);
      if (iVar1 == 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                      ,0xe9,"void sznet::MinHeap<event>::checkHeap() [T = event]");
      }
    } while (((int)uVar4 != 0) || (uVar5 = uVar6 - 1, uVar6 = uVar5, uVar5 != 0));
  }
  return;
}

Assistant:

void checkHeap()
	{
		for (uint32_t index = (m_size - 1); index > 0; --index)
		{
			uint32_t curIndex = index;
			while (true)
			{
				// 当前节点下标的爸爸下标
				uint32_t parent_index = parent(curIndex);
				// 判断父亲节点是否比当前节点小
				auto r = m_pCmpFunc(m_ptrArr[parent_index], m_ptrArr[curIndex]);
				if (r == 1)
				{
					// 不要那就错了
					assert(0);
				}
				if (parent_index == 0)
				{
					break;
				}
				--curIndex;
			}
		}
	}